

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerBoundCheck(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  undefined2 uVar2;
  code *pcVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  OpndKind OVar7;
  int32 iVar8;
  BailOutKind bailOutKindToLower;
  undefined4 *puVar9;
  LabelInstr *target;
  Lowerer *pLVar10;
  Opnd *this_00;
  Lowerer *this_01;
  Lowerer *opnd;
  IntConstOpnd *pIVar11;
  char *pcVar12;
  char *pcVar13;
  undefined1 left [8];
  uint uVar14;
  undefined1 local_70 [8];
  AutoReuseOpnd autoReuseAddResultOpnd;
  Lowerer *local_50;
  LabelInstr *local_48;
  OpCode local_32;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3577,"(instr)","instr");
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  uVar2 = instr->m_opcode;
  if (1 < (ushort)(uVar2 - 0x207)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3578,
                       "(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck)"
                       ,
                       "instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck"
                      );
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  if (instr->m_opcode == UnsignedBoundCheck) {
    OVar7 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x357f,"(instr->GetSrc1()->IsRegOpnd())","instr->GetSrc1()->IsRegOpnd()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
    if (instr->m_src1->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3580,"(instr->GetSrc1()->IsInt32())","instr->GetSrc1()->IsInt32()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
    if (instr->m_src2 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3581,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
    OVar7 = IR::Opnd::GetKind(instr->m_src2);
    if (OVar7 == OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3582,"(!instr->GetSrc2()->IsIntConstOpnd())",
                         "!instr->GetSrc2()->IsIntConstOpnd()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
    pIVar11 = (IntConstOpnd *)instr->m_dst;
    if (pIVar11 != (IntConstOpnd *)0x0) {
      OVar7 = IR::Opnd::GetKind((Opnd *)pIVar11);
      if (OVar7 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_005c486f;
        *puVar9 = 0;
      }
      iVar8 = IR::IntConstOpnd::AsInt32(pIVar11);
      if (1 < iVar8 + 1U) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3586,"(c == 0 || c == -1)","c == 0 || c == -1");
        if (!bVar6) goto LAB_005c486f;
        *puVar9 = 0;
      }
    }
  }
  bailOutKindToLower = IR::Instr::GetBailOutKind(instr);
  if (((1 < bailOutKindToLower - BailOutOnFailedHoistedBoundCheck) &&
      (bailOutKindToLower != BailOutOnArrayAccessHelperCall)) &&
     (bailOutKindToLower != BailOutOnInvalidatedArrayHeadSegment)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3590,
                       "(bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                       ,
                       "bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                      );
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  LowerOneBailOutKind(this,instr,bailOutKindToLower,false,false);
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3594,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  local_48 = (LabelInstr *)instr->m_next;
  local_50 = (Lowerer *)IR::Instr::UnlinkSrc1(instr);
  if (local_50 == (Lowerer *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar13 = "(isRightOpnd)";
    pcVar12 = "isRightOpnd";
    uVar14 = 0x359c;
LAB_005c431b:
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,uVar14,pcVar13,pcVar12);
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  else {
    OVar7 = IR::Opnd::GetKind((Opnd *)local_50);
    if ((OVar7 != OpndKindIntConst) &&
       ((*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   &(local_50->m_lowererMD).FloatPrefThreshold + 1) | 4) != 7)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pcVar13 = "(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32)";
      pcVar12 = "opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32";
      uVar14 = 0x35a4;
      goto LAB_005c431b;
    }
  }
  pLVar10 = (Lowerer *)IR::Instr::UnlinkSrc2(instr);
  if (pLVar10 != (Lowerer *)0x0) {
    OVar7 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar7 == OpndKindIntConst) {
      OVar7 = IR::Opnd::GetKind((Opnd *)pLVar10);
      if (OVar7 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_005c486f;
        *puVar9 = 0;
      }
      if ((pLVar10->m_lowererMD).m_func == (Func *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        pcVar13 = "(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0)";
        pcVar12 = "!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0";
        uVar14 = 0x35a1;
LAB_005c444e:
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,uVar14,pcVar13,pcVar12);
        if (!bVar6) goto LAB_005c486f;
        *puVar9 = 0;
      }
    }
    else if ((*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(pLVar10->m_lowererMD).FloatPrefThreshold + 1) | 4) != 7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pcVar13 = "(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32)";
      pcVar12 = "opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32";
      uVar14 = 0x35a4;
      goto LAB_005c444e;
    }
  }
  OVar7 = IR::Opnd::GetKind((Opnd *)local_50);
  if ((OVar7 == OpndKindIntConst) &&
     ((pLVar10 == (Lowerer *)0x0 ||
      (OVar7 = IR::Opnd::GetKind((Opnd *)pLVar10), OVar7 == OpndKindIntConst)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x35ad,
                       "(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd())",
                       "!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd()");
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    this_00 = (Opnd *)0x0;
  }
  else {
    this_00 = IR::Instr::UnlinkDst(instr);
    OVar7 = IR::Opnd::GetKind(this_00);
    if (OVar7 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
  }
  if ((this_00 != (Opnd *)0x0) && (this_00[1]._vptr_Opnd == (_func_int **)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x35af,"(!offsetOpnd || offsetOpnd->GetValue() != 0)",
                       "!offsetOpnd || offsetOpnd->GetValue() != 0");
    if (!bVar6) goto LAB_005c486f;
    *puVar9 = 0;
  }
  OVar1 = instr->m_opcode;
  IR::Instr::Remove(instr);
  if (this_00 == (Opnd *)0x0) {
    left = (undefined1  [8])0x0;
  }
  else {
    left = (undefined1  [8])this_00[1]._vptr_Opnd;
  }
  autoReuseAddResultOpnd._16_8_ = (local_48->super_Instr).m_func;
  OVar7 = IR::Opnd::GetKind((Opnd *)local_50);
  local_32 = BrLe_A;
  bVar4 = 1;
  if (((OVar7 == OpndKindIntConst) &&
      (OVar7 = IR::Opnd::GetKind((Opnd *)pLVar10), left != (undefined1  [8])0xffffffff80000000)) &&
     (OVar7 == OpndKindReg)) {
    left = (undefined1  [8])-(long)left;
    local_32 = BrGe_A;
    bVar5 = 1;
    bVar4 = 0;
    this_01 = local_50;
    local_50 = pLVar10;
  }
  else {
    bVar5 = 0;
    this_01 = pLVar10;
  }
  pLVar10 = this_01;
  OVar7 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar7 == OpndKindIntConst) {
    OVar7 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar7 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar6) goto LAB_005c486f;
      *puVar9 = 0;
    }
    pLVar10 = (Lowerer *)left;
    bVar6 = IntConstMath::Add((IntConstType)left,(IntConstType)(this_01->m_lowererMD).m_func,TyInt32
                              ,(IntConstType *)local_70);
    if (!bVar6) {
      this_00 = (Opnd *)0x0;
      this_01 = (Lowerer *)0x0;
      left = local_70;
    }
  }
  local_70 = (undefined1  [8])0x0;
  autoReuseAddResultOpnd.func._1_1_ = 1;
  if ((bool)(bVar4 & left == (undefined1  [8])&DAT_ffffffffffffffff)) {
    local_32 = BrLt_A;
  }
  else {
    if (!(bool)(bVar5 & left == (undefined1  [8])&DAT_00000001)) {
      if (this_01 != (Lowerer *)0x0 && left != (undefined1  [8])0x0) {
        local_48 = IR::Instr::GetOrCreateContinueLabel((local_48->super_Instr).m_prev,true);
        if ((this_00 != (Opnd *)0x0) && ((undefined1  [8])this_00[1]._vptr_Opnd != left)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x35e3,"(!offsetOpnd || offsetOpnd->GetValue() == offset)",
                             "!offsetOpnd || offsetOpnd->GetValue() == offset");
          if (!bVar6) {
LAB_005c486f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        opnd = (Lowerer *)IR::RegOpnd::New(TyInt32,(Func *)autoReuseAddResultOpnd._16_8_);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)local_70,(Opnd *)opnd,(Func *)autoReuseAddResultOpnd._16_8_,true
                  );
        if (this_00 == (Opnd *)0x0) {
          pIVar11 = IR::IntConstOpnd::New
                              ((IntConstType)left,TyInt32,(Func *)autoReuseAddResultOpnd._16_8_,
                               false);
        }
        else {
          pIVar11 = (IntConstOpnd *)
                    IR::Opnd::UseWithNewType(this_00,TyInt32,(Func *)autoReuseAddResultOpnd._16_8_);
        }
        InsertAdd(true,(Opnd *)opnd,(Opnd *)this_01,&pIVar11->super_Opnd,&local_48->super_Instr);
        pLVar10 = (Lowerer *)0x42b;
        InsertBranch(JO,false,local_48,&local_48->super_Instr);
        this_01 = opnd;
      }
      goto LAB_005c46ee;
    }
    local_32 = BrGt_A;
  }
  left = (undefined1  [8])0x0;
LAB_005c46ee:
  if (this_01 == (Lowerer *)0x0) {
    this_01 = (Lowerer *)
              IR::IntConstOpnd::New
                        ((IntConstType)left,TyInt32,(Func *)autoReuseAddResultOpnd._16_8_,false);
    pLVar10 = (Lowerer *)left;
  }
  InsertCompareBranch(pLVar10,(Opnd *)local_50,(Opnd *)this_01,local_32,OVar1 == UnsignedBoundCheck,
                      target,&local_48->super_Instr,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_70);
  return;
}

Assistant:

void Lowerer::LowerBoundCheck(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck);

#if DBG
    if(instr->m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        // UnsignedBoundCheck is currently only supported for the pattern:
        //     UnsignedBoundCheck s1 <= s2 + c, where c == 0 || c == -1
        Assert(instr->GetSrc1()->IsRegOpnd());
        Assert(instr->GetSrc1()->IsInt32());
        Assert(instr->GetSrc2());
        Assert(!instr->GetSrc2()->IsIntConstOpnd());
        if(instr->GetDst())
        {
            const int32 c = instr->GetDst()->AsIntConstOpnd()->AsInt32();
            Assert(c == 0 || c == -1);
        }
    }
#endif

    const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKind == IR::BailOutOnArrayAccessHelperCall ||
        bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment ||
        bailOutKind == IR::BailOutOnFailedHoistedBoundCheck ||
        bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(false);
    LowerOneBailOutKind(instr, bailOutKind, false);
    Assert(!instr->HasBailOutInfo());
    IR::Instr *insertBeforeInstr = instr->m_next;

#if DBG
    const auto VerifyLeftOrRightOpnd = [&](IR::Opnd *const opnd, const bool isRightOpnd)
    {
        if(!opnd)
        {
            Assert(isRightOpnd);
            return;
        }
        if(opnd->IsIntConstOpnd())
        {
            Assert(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0);
            return;
        }
        Assert(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32);
    };
#endif

    // left <= right + offset (src1 <= src2 + dst)
    IR::Opnd *leftOpnd = instr->UnlinkSrc1();
    DebugOnly(VerifyLeftOrRightOpnd(leftOpnd, false));
    IR::Opnd *rightOpnd = instr->UnlinkSrc2();
    DebugOnly(VerifyLeftOrRightOpnd(rightOpnd, true));
    Assert(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd());
    IR::IntConstOpnd *offsetOpnd = instr->GetDst() ? instr->UnlinkDst()->AsIntConstOpnd() : nullptr;
    Assert(!offsetOpnd || offsetOpnd->GetValue() != 0);
    const bool doUnsignedCompare = instr->m_opcode == Js::OpCode::UnsignedBoundCheck;
    instr->Remove();

    Func *const func = insertBeforeInstr->m_func;

    IntConstType offset = offsetOpnd ? offsetOpnd->GetValue() : 0;
    Js::OpCode compareOpCode = Js::OpCode::BrLe_A;
    if(leftOpnd->IsIntConstOpnd() && rightOpnd->IsRegOpnd() && offset != IntConstMin)
    {
        // Put the constants together: swap the operands, negate the offset, and invert the branch
        IR::Opnd *const tempOpnd = leftOpnd;
        leftOpnd = rightOpnd;
        rightOpnd = tempOpnd;
        offset = -offset;
        compareOpCode = Js::OpCode::BrGe_A;
    }

    if(rightOpnd->IsIntConstOpnd())
    {
        // Try to aggregate right + offset into a constant offset
        IntConstType newOffset;
        if(!IntConstMath::Add(offset, rightOpnd->AsIntConstOpnd()->GetValue(), TyInt32, &newOffset))
        {
            offset = newOffset;
            rightOpnd = nullptr;
            offsetOpnd = nullptr;
        }
    }

    // Determine if the Add for (right + offset) is necessary, and the op code that will be used for the comparison
    IR::AutoReuseOpnd autoReuseAddResultOpnd;
    if(offset == -1 && compareOpCode == Js::OpCode::BrLe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrLt_A;
    }
    else if(offset == 1 && compareOpCode == Js::OpCode::BrGe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrGt_A;
    }
    else if(offset != 0 && rightOpnd)
    {
        // Need to Add (right + offset). If it overflows, bail out.
        IR::LabelInstr *const bailOutLabel = insertBeforeInstr->m_prev->GetOrCreateContinueLabel(true);
        insertBeforeInstr = bailOutLabel;

        //     mov  temp, right
        //     add  temp, offset
        //     jo   $bailOut
        // $bailOut: (insertBeforeInstr)
        Assert(!offsetOpnd || offsetOpnd->GetValue() == offset);
        IR::RegOpnd *const addResultOpnd = IR::RegOpnd::New(TyInt32, func);
        autoReuseAddResultOpnd.Initialize(addResultOpnd, func);
        InsertAdd(
            true,
            addResultOpnd,
            rightOpnd,
            offsetOpnd ? offsetOpnd->UseWithNewType(TyInt32, func) : IR::IntConstOpnd::New(offset, TyInt32, func),
            insertBeforeInstr);
        InsertBranch(LowererMD::MDOverflowBranchOpcode, bailOutLabel, insertBeforeInstr);

        rightOpnd = addResultOpnd;
    }

    //     cmp  left, right
    //     jl[e] $skipBailOut
    // $bailOut:
    if(!rightOpnd)
    {
        rightOpnd = IR::IntConstOpnd::New(offset, TyInt32, func);
    }
    InsertCompareBranch(leftOpnd, rightOpnd, compareOpCode, doUnsignedCompare, skipBailOutLabel, insertBeforeInstr);
}